

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

BinOpr getbinopr(int op)

{
  undefined4 local_c;
  int op_local;
  
  if (op == 0x25) {
    local_c = OPR_MOD;
  }
  else if (op == 0x2a) {
    local_c = OPR_MUL;
  }
  else if (op == 0x2b) {
    local_c = OPR_ADD;
  }
  else if (op == 0x2d) {
    local_c = OPR_SUB;
  }
  else if (op == 0x2f) {
    local_c = OPR_DIV;
  }
  else if (op == 0x3c) {
    local_c = OPR_LT;
  }
  else if (op == 0x3e) {
    local_c = OPR_GT;
  }
  else if (op == 0x5e) {
    local_c = OPR_POW;
  }
  else if (op == 0x101) {
    local_c = OPR_AND;
  }
  else if (op == 0x10f) {
    local_c = OPR_OR;
  }
  else if (op == 0x116) {
    local_c = OPR_CONCAT;
  }
  else if (op == 0x118) {
    local_c = OPR_EQ;
  }
  else if (op == 0x119) {
    local_c = OPR_GE;
  }
  else if (op == 0x11a) {
    local_c = OPR_LE;
  }
  else if (op == 0x11b) {
    local_c = OPR_NE;
  }
  else {
    local_c = OPR_NOBINOPR;
  }
  return local_c;
}

Assistant:

static BinOpr getbinopr(int op){
switch(op){
case'+':return OPR_ADD;
case'-':return OPR_SUB;
case'*':return OPR_MUL;
case'/':return OPR_DIV;
case'%':return OPR_MOD;
case'^':return OPR_POW;
case TK_CONCAT:return OPR_CONCAT;
case TK_NE:return OPR_NE;
case TK_EQ:return OPR_EQ;
case'<':return OPR_LT;
case TK_LE:return OPR_LE;
case'>':return OPR_GT;
case TK_GE:return OPR_GE;
case TK_AND:return OPR_AND;
case TK_OR:return OPR_OR;
default:return OPR_NOBINOPR;
}
}